

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

int flatbuffers::Vector<keyfield::sample::Bar_const*,unsigned_int>::
    KeyCompare<flatbuffers::Array<float,(unsigned_short)3>*>(void *ap,void *bp)

{
  float fVar1;
  float fVar2;
  int in_EAX;
  long lVar3;
  Array<float,_(unsigned_short)3> **key;
  
  lVar3 = 0;
  do {
    fVar1 = *(float *)((long)bp + lVar3 * 4);
    fVar2 = *(float *)(*ap + lVar3 * 4);
    if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
      in_EAX = (uint)(fVar2 < fVar1) - (uint)(fVar1 < fVar2);
    }
    if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) goto LAB_0016c2f1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  in_EAX = 0;
LAB_0016c2f1:
  return -in_EAX;
}

Assistant:

static int KeyCompare(const void *ap, const void *bp) {
    const K *key = reinterpret_cast<const K *>(ap);
    const uint8_t *data = reinterpret_cast<const uint8_t *>(bp);
    auto table = IndirectHelper<T>::Read(data, 0);

    // std::bsearch compares with the operands transposed, so we negate the
    // result here.
    return -table->KeyCompareWithValue(*key);
  }